

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t byte_decode(uint8_t *ibuff,size_t isize,uint64_t max,uint64_t *v)

{
  byte *pbVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 0;
  sVar3 = 0;
  lVar6 = 0;
  for (uVar4 = max - 1; uVar4 != 0; uVar4 = uVar4 >> 8) {
    pbVar1 = ibuff + sVar3;
    sVar3 = sVar3 + 1;
    uVar2 = uVar5 & 0x3f;
    uVar5 = uVar5 + 8;
    lVar6 = lVar6 + ((ulong)*pbVar1 << uVar2);
  }
  *v = lVar6 + 1;
  return sVar3;
}

Assistant:

size_t byte_decode(
    const uint8_t* ibuff, size_t isize, uint64_t max, uint64_t* v)
{
    size_t ip = 0;
    uint64_t newv = 0;
    int offset = 0;
    max--; /* working here with zero-origin values */
    while (max) {
        // myassert(ip < isize);
        newv += (((uint64_t)ibuff[ip++]) << offset);
        max >>= 8;
        offset += 8;
    }
    *v = newv + 1;
    return ip;
}